

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_33804::
ARTCorrectnessTest_MemoryAccountingDuplicateKeyInsert_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTCorrectnessTest_MemoryAccountingDuplicateKeyInsert_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_00;
  bool bVar1;
  char *pcVar2;
  key_view kVar3;
  value_view v;
  value_type v_00;
  undefined1 local_160 [8];
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  pointer local_70;
  pointer local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  AssertHelper local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  AssertHelper local_20;
  
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)local_160,false);
  kVar3 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_160,0);
  pcVar2 = (char *)0x0;
  v._M_extent._M_extent_value = 1;
  v._M_ptr = &unodb::test::test_value_1;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_160,kVar3,v,false);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  kVar3 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_160,0);
  this_00 = &verifier.test_db;
  v_00._M_extent._M_extent_value = 2;
  v_00._M_ptr = (pointer)&unodb::test::test_value_2;
  bVar1 = unodb::
          mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::insert_internal((mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                             *)this_00,(art_key_type)kVar3,v_00);
  local_30._M_head_impl._0_1_ = !bVar1;
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,(internal *)&local_30,
               (AssertionResult *)"verifier.try_insert(0, unodb::test::test_values[1])","true",
               "false",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art.cpp"
               ,0x38a,(char *)CONCAT71(local_58._1_7_,local_58[0]));
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_58._1_7_,local_58[0]) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_58._1_7_,local_58[0]),local_48._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_20.data_._4_4_,local_20.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_20.data_._4_4_,local_20.data_._0_4_) + 8))();
    }
    if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_28,local_28);
    }
  }
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  unodb::test::allocation_failure_injector::allocation_counter.super___atomic_base<unsigned_long>.
  _M_i = (__atomic_base<unsigned_long>)0;
  kVar3 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_160,0);
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::do_remove((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
               *)local_160,kVar3,false);
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       unodb::
       mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
       ::get_current_memory_use
                 ((mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                   *)this_00);
  local_20.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_58,"(verifier.get_db().get_current_memory_use())","(0)",
             (unsigned_long *)&local_30,(int *)&local_20);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art.cpp"
               ,0x38d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  if (local_70 != (pointer)0x0) {
    operator_delete(local_70,(long)local_60 - (long)local_70);
  }
  std::
  _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               *)&verifier.values._M_t._M_impl.super__Rb_tree_header._M_node_count);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::~db((db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
         *)this_00);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, MemoryAccountingDuplicateKeyInsert) {
  unodb::test::tree_verifier<TypeParam> verifier;
  verifier.insert(0, unodb::test::test_values[0]);
  unodb::test::must_not_allocate([&verifier] {
    UNODB_ASSERT_FALSE(verifier.try_insert(0, unodb::test::test_values[1]));
  });
  verifier.remove(0);
  UNODB_ASSERT_EQ(verifier.get_db().get_current_memory_use(), 0);
}